

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

int InitPassStats(VP8Encoder *enc,PassStats *s)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  WebPConfig *pWVar5;
  double dVar6;
  float fVar7;
  float fVar9;
  undefined1 auVar8 [16];
  float fVar10;
  
  pWVar5 = enc->config_;
  iVar4 = pWVar5->target_size;
  fVar1 = pWVar5->target_PSNR;
  s->is_first = 1;
  s->dq = 10.0;
  uVar2 = pWVar5->qmin;
  uVar3 = pWVar5->qmax;
  fVar7 = (float)(int)uVar2;
  fVar9 = (float)(int)uVar3;
  s->qmin = fVar7;
  s->qmax = fVar9;
  fVar10 = pWVar5->quality;
  if (fVar10 <= fVar9) {
    fVar9 = fVar10;
  }
  fVar10 = (float)(-(uint)(fVar10 < fVar7) & (uint)fVar7 | ~-(uint)(fVar10 < fVar7) & (uint)fVar9);
  s->last_q = fVar10;
  s->q = fVar10;
  if ((long)iVar4 == 0) {
    if (0.0 < fVar1) {
      dVar6 = (double)fVar1;
    }
    else {
      dVar6 = 40.0;
    }
  }
  else {
    auVar8._8_4_ = iVar4 >> 0x1f;
    auVar8._0_8_ = (long)iVar4;
    auVar8._12_4_ = 0x45300000;
    dVar6 = (auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0);
  }
  s->target = dVar6;
  s->value = 0.0;
  s->last_value = 0.0;
  s->do_size_search = (uint)(iVar4 != 0);
  return iVar4;
}

Assistant:

static int InitPassStats(const VP8Encoder* const enc, PassStats* const s) {
  const uint64_t target_size = (uint64_t)enc->config_->target_size;
  const int do_size_search = (target_size != 0);
  const float target_PSNR = enc->config_->target_PSNR;

  s->is_first = 1;
  s->dq = 10.f;
  s->qmin = 1.f * enc->config_->qmin;
  s->qmax = 1.f * enc->config_->qmax;
  s->q = s->last_q = Clamp(enc->config_->quality, s->qmin, s->qmax);
  s->target = do_size_search ? (double)target_size
            : (target_PSNR > 0.) ? target_PSNR
            : 40.;   // default, just in case
  s->value = s->last_value = 0.;
  s->do_size_search = do_size_search;
  return do_size_search;
}